

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsview.cpp
# Opt level: O3

QRegion __thiscall
QGraphicsViewPrivate::rubberBandRegion(QGraphicsViewPrivate *this,QWidget *widget,QRect *rect)

{
  int iVar1;
  QStyle *pQVar2;
  int *in_RCX;
  long in_FS_OFFSET;
  QStyleOptionRubberBand option;
  QRect local_a8;
  QStyleHintReturnMask local_98;
  undefined1 local_88 [16];
  undefined1 *local_78;
  undefined1 *puStack_70;
  undefined1 *local_68;
  QPalettePrivate *pQStack_60;
  undefined1 *local_58;
  QObject *pQStack_50;
  undefined8 local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_98.super_QStyleHintReturn = (QStyleHintReturn)&DAT_aaaaaaaaaaaaaaaa;
  local_98.region.d = (QRegionData *)&DAT_aaaaaaaaaaaaaaaa;
  QStyleHintReturnMask::QStyleHintReturnMask(&local_98);
  local_48 = &DAT_aaaaaaaaaaaaaaaa;
  local_58 = &DAT_aaaaaaaaaaaaaaaa;
  pQStack_50 = (QObject *)&DAT_aaaaaaaaaaaaaaaa;
  local_68 = &DAT_aaaaaaaaaaaaaaaa;
  pQStack_60 = (QPalettePrivate *)&DAT_aaaaaaaaaaaaaaaa;
  local_78 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_70 = &DAT_aaaaaaaaaaaaaaaa;
  local_88._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_88._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QStyleOptionRubberBand::QStyleOptionRubberBand((QStyleOptionRubberBand *)local_88);
  QStyleOption::initFrom((QStyleOption *)local_88,(QWidget *)rect);
  local_78._0_4_ = in_RCX[0];
  local_78._4_4_ = in_RCX[1];
  puStack_70._0_4_ = in_RCX[2];
  puStack_70._4_4_ = in_RCX[3];
  local_48._4_4_ = (uint)((ulong)local_48 >> 0x20) & 0xffffff00;
  local_48._0_4_ = Rectangle;
  *(undefined1 **)&(this->super_QAbstractScrollAreaPrivate).super_QFramePrivate.super_QWidgetPrivate
       = &DAT_aaaaaaaaaaaaaaaa;
  QRegion::QRegion((QRegion *)this);
  local_a8.x1.m_i = *in_RCX + -1;
  local_a8.x2.m_i = in_RCX[2] + 1;
  local_a8.y1.m_i = in_RCX[1] + -1;
  local_a8.y2.m_i = in_RCX[3] + 1;
  QRegion::operator+=((QRegion *)this,&local_a8);
  pQVar2 = QWidget::style((QWidget *)rect);
  iVar1 = (**(code **)(*(long *)pQVar2 + 0xf0))
                    (pQVar2,0x36,(QStyleOptionRubberBand *)local_88,rect,&local_98);
  if (iVar1 != 0) {
    QRegion::operator&=((QRegion *)this,&local_98.region);
  }
  QStyleOption::~QStyleOption((QStyleOption *)local_88);
  QStyleHintReturnMask::~QStyleHintReturnMask(&local_98);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return (QRegion)(QRegionData *)this;
  }
  __stack_chk_fail();
}

Assistant:

QRegion QGraphicsViewPrivate::rubberBandRegion(const QWidget *widget, const QRect &rect) const
{
    QStyleHintReturnMask mask;
    QStyleOptionRubberBand option;
    option.initFrom(widget);
    option.rect = rect;
    option.opaque = false;
    option.shape = QRubberBand::Rectangle;

    QRegion tmp;
    tmp += rect.adjusted(-1, -1, 1, 1);
    if (widget->style()->styleHint(QStyle::SH_RubberBand_Mask, &option, widget, &mask))
        tmp &= mask.region;
    return tmp;
}